

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# index.h
# Opt level: O2

void __thiscall
booster::locale::boundary::details::
segment_index_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::update_current(segment_index_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *this,pair<unsigned_long,_unsigned_long> pos)

{
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *p_Var1;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  difference_type __d;
  
  sVar2 = get_offset(this,pos.first);
  sVar3 = get_offset(this,(this->current_).first);
  sVar4 = get_offset(this,pos.second);
  sVar5 = get_offset(this,(this->current_).second);
  (this->value_).
  super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .first._M_current =
       (this->value_).
       super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       .first._M_current + (sVar2 - sVar3);
  p_Var1 = &(this->value_).
            super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .second;
  p_Var1->_M_current = p_Var1->_M_current + (sVar4 - sVar5);
  (this->current_).first = pos.first;
  (this->current_).second = pos.second;
  update_rule(this);
  return;
}

Assistant:

void update_current(std::pair<size_t,size_t> pos)
                    {
                        std::ptrdiff_t first_diff = get_offset(pos.first) - get_offset(current_.first);
                        std::ptrdiff_t second_diff = get_offset(pos.second) - get_offset(current_.second);
                        std::advance(value_.first,first_diff);
                        std::advance(value_.second,second_diff);
                        current_ = pos;
                        update_rule();
                    }